

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

TokenOrSyntax * __thiscall
slang::syntax::ParameterDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ParameterDeclarationSyntax *this,size_t index)

{
  Info *pIVar1;
  DataTypeSyntax *pDVar2;
  
  if (index == 2) {
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->declarators).super_SyntaxListBase.super_SyntaxNode;
  }
  else {
    if (index != 1) {
      if (index == 0) {
        pIVar1 = (this->super_ParameterDeclarationBaseSyntax).keyword.info;
        *(undefined8 *)
         &(__return_storage_ptr__->super_ConstTokenOrSyntax).
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
             *(undefined8 *)&(this->super_ParameterDeclarationBaseSyntax).keyword;
        *(Info **)((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  + 8) = pIVar1;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                 super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
         0x10) = '\0';
        return __return_storage_ptr__;
      }
      TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
      return __return_storage_ptr__;
    }
    pDVar2 = not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
    *(DataTypeSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pDVar2;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\x01';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ParameterDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return type.get();
        case 2: return &declarators;
        default: return nullptr;
    }
}